

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_>
wallet::MakeSQLiteDatabase
          (path *path,DatabaseOptions *options,DatabaseStatus *status,bilingual_str *error)

{
  long lVar1;
  bool bVar2;
  undefined4 *in_RCX;
  long in_RDX;
  __uniq_ptr_data<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>,_true,_true>
  in_RDI;
  path *in_R8;
  long in_FS_OFFSET;
  runtime_error *e;
  __single_object db;
  path data_file;
  path *in_stack_fffffffffffffec8;
  unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_>
  *in_stack_fffffffffffffed8;
  path *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  path *in_stack_ffffffffffffff08;
  bilingual_str *in_stack_ffffffffffffffc0;
  SQLiteDatabase *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SQLiteDataFile(in_stack_fffffffffffffef8);
  std::filesystem::__cxx11::path::parent_path();
  std::
  make_unique<wallet::SQLiteDatabase,std::filesystem::__cxx11::path,fs::path&,wallet::DatabaseOptions_const&>
            (in_R8,in_stack_ffffffffffffff08,
             (DatabaseOptions *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffec8);
  if ((*(byte *)(in_RDX + 0x38) & 1) != 0) {
    std::unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_>::
    operator->((unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_> *)
               in_stack_fffffffffffffec8);
    bVar2 = SQLiteDatabase::Verify(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (!bVar2) {
      *in_RCX = 8;
      std::unique_ptr<wallet::SQLiteDatabase,std::default_delete<wallet::SQLiteDatabase>>::
      unique_ptr<std::default_delete<wallet::SQLiteDatabase>,void>
                ((unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_> *
                 )in_stack_fffffffffffffec8,(nullptr_t)0x17aeb4e);
      goto LAB_017aebe7;
    }
  }
  *in_RCX = 0;
  std::unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_>::unique_ptr
            ((unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_> *)
             in_stack_fffffffffffffec8,
             (unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_> *)
             0x17aebdf);
LAB_017aebe7:
  std::unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_>::~unique_ptr
            (in_stack_fffffffffffffed8);
  fs::path::~path((path *)in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>,_true,_true>
            )(tuple<wallet::SQLiteDatabase_*,_std::default_delete<wallet::SQLiteDatabase>_>)
             in_RDI.
             super___uniq_ptr_impl<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::SQLiteDatabase_*,_std::default_delete<wallet::SQLiteDatabase>_>
             .super__Head_base<0UL,_wallet::SQLiteDatabase_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<SQLiteDatabase> MakeSQLiteDatabase(const fs::path& path, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error)
{
    try {
        fs::path data_file = SQLiteDataFile(path);
        auto db = std::make_unique<SQLiteDatabase>(data_file.parent_path(), data_file, options);
        if (options.verify && !db->Verify(error)) {
            status = DatabaseStatus::FAILED_VERIFY;
            return nullptr;
        }
        status = DatabaseStatus::SUCCESS;
        return db;
    } catch (const std::runtime_error& e) {
        status = DatabaseStatus::FAILED_LOAD;
        error = Untranslated(e.what());
        return nullptr;
    }
}